

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndChild(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float flags;
  float fVar4;
  ImVec2 sz;
  ImRect bb;
  ImVec2 local_50;
  undefined1 local_48 [8];
  ImVec2 IStack_40;
  ImRect local_38;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  GImGui->WithinEndChild = true;
  if (pIVar1->BeginCount < 2) {
    local_50 = pIVar1->Size;
    fVar3 = local_50.x;
    flags = local_50.y;
    if ((pIVar1->AutoFitChildAxises & 1U) != 0) {
      fVar4 = 4.0;
      if (4.0 <= fVar3) {
        fVar4 = fVar3;
      }
      fVar3 = fVar4;
      local_50.y = flags;
      local_50.x = fVar3;
    }
    fVar4 = flags;
    if ((pIVar1->AutoFitChildAxises & 2U) != 0) {
      fVar4 = 4.0;
      if (4.0 <= flags) {
        fVar4 = flags;
      }
      local_50.y = fVar4;
    }
    local_48._4_4_ = fVar4;
    local_48._0_4_ = fVar3;
    IStack_40 = (ImVec2)0x0;
    End();
    local_38.Min = (pIVar2->CurrentWindow->DC).CursorPos;
    IStack_40.x = (float)local_48._0_4_ + local_38.Min.x;
    IStack_40.y = (float)local_48._4_4_ + local_38.Min.y;
    local_38.Max.y = IStack_40.y;
    local_38.Max.x = IStack_40.x;
    local_48._0_4_ = local_38.Min.x;
    local_48._4_4_ = local_38.Min.y;
    ItemSize(&local_50,-1.0);
    if ((((pIVar1->DC).NavLayerActiveMask == 0) && ((pIVar1->DC).NavHasScroll != true)) ||
       ((pIVar1->Flags & 0x800000) != 0)) {
      ItemAdd(&local_38,0,(ImRect *)0x0);
    }
    else {
      ItemAdd(&local_38,pIVar1->ChildId,(ImRect *)0x0);
      RenderNavHighlight((ImGui *)&local_38,(ImRect *)(ulong)pIVar1->ChildId,1,
                         (ImGuiNavHighlightFlags)flags);
      if (((pIVar1->DC).NavLayerActiveMask == 0) && (pIVar1 == pIVar2->NavWindow)) {
        local_28 = (float)local_48._0_4_ + -2.0;
        fStack_24 = (float)local_48._4_4_ + -2.0;
        fStack_20 = IStack_40.x + 2.0;
        fStack_1c = IStack_40.y + 2.0;
        RenderNavHighlight((ImGui *)&local_28,(ImRect *)(ulong)pIVar2->NavId,2,
                           (ImGuiNavHighlightFlags)flags);
      }
    }
  }
  else {
    End();
  }
  pIVar2->WithinEndChild = false;
  return;
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.WithinEndChild == false);
    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() calls

    g.WithinEndChild = true;
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayerActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayerActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2, 2), bb.Max + ImVec2(2, 2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
    }
    g.WithinEndChild = false;
}